

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O1

void P_BloodSplatter2(DVector3 *pos,AActor *originator,DAngle *hitangle)

{
  byte *pbVar1;
  uint kind;
  int iVar2;
  uint uVar3;
  uint uVar4;
  undefined4 extraout_var;
  PClassActor *type;
  AActor *pAVar5;
  uint uVar6;
  double dVar7;
  double dVar8;
  DAngle local_50;
  DVector3 local_48;
  
  if ((originator->super_DThinker).super_DObject.Class == (PClass *)0x0) {
    iVar2 = (**(originator->super_DThinker).super_DObject._vptr_DObject)(originator);
    (originator->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar2);
  }
  kind = *(uint *)&(originator->super_DThinker).super_DObject.Class[1].super_PNativeStruct.
                   super_PStruct.super_PNamedType.super_PCompoundType.super_PType.Conversions.Array;
  type = AActor::GetBloodType(originator,2);
  uVar6 = cl_bloodtype.Value;
  if (type != (PClassActor *)0x0) {
    uVar6 = cl_bloodtype.Value & (*(int *)((type->super_PClass).Defaults + 0x1c8) << 4) >> 0x1f;
  }
  uVar3 = FRandom::GenRand32(&pr_splat);
  uVar4 = FRandom::GenRand32(&pr_splat);
  dVar7 = (double)(int)((uVar3 & 0xff) - 0x80) * 0.03125;
  dVar8 = (double)(int)((uVar4 & 0xff) - 0x80) * 0.03125;
  if (type != (PClassActor *)0x0) {
    local_48.X = pos->X + dVar7;
    local_48.Y = pos->Y + dVar8;
    local_48.Z = pos->Z;
    pAVar5 = AActor::StaticSpawn(type,&local_48,NO_REPLACE,false);
    (pAVar5->target).field_0.p = originator;
    if ((kind != 0) && (((pAVar5->flags2).Value & 0x10000) == 0)) {
      pAVar5->Translation = kind >> 0x18 | 0x80000;
    }
    if (1 < (int)uVar6) {
      pbVar1 = (byte *)((long)&(pAVar5->renderflags).Value + 1);
      *pbVar1 = *pbVar1 | 0x80;
    }
  }
  if (0 < (int)uVar6) {
    local_48.X = dVar7 + pos->X;
    local_48.Y = dVar8 + pos->Y;
    local_48.Z = pos->Z;
    local_50.Degrees = hitangle->Degrees + -180.0;
    P_DrawSplash2(0x28,&local_48,&local_50,2,kind);
  }
  return;
}

Assistant:

void P_BloodSplatter2 (const DVector3 &pos, AActor *originator, DAngle hitangle)
{
	PalEntry bloodcolor = originator->GetBloodColor();
	PClassActor *bloodcls = originator->GetBloodType(2);

	int bloodtype = cl_bloodtype;
	
	if (bloodcls != NULL && !(GetDefaultByType(bloodcls)->flags4 & MF4_ALLOWPARTICLES))
		bloodtype = 0;

	DVector2 add;
	add.X = (pr_splat() - 128) / 32.;
	add.Y = (pr_splat() - 128) / 32.;

	if (bloodcls != NULL)
	{
		AActor *mo;


		mo = Spawn (bloodcls, pos + add, NO_REPLACE); // GetBloodType already performed the replacement
		mo->target = originator;

		// colorize the blood!
		if (bloodcolor != 0 && !(mo->flags2 & MF2_DONTTRANSLATE))
		{
			mo->Translation = TRANSLATION(TRANSLATION_Blood, bloodcolor.a);
		}

		if (!(bloodtype <= 1)) mo->renderflags |= RF_INVISIBLE;
	}
	if (bloodtype >= 1)
	{
		P_DrawSplash2(40, pos + add, hitangle - 180., 2, bloodcolor);
	}
}